

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Fodder * __thiscall
jsonnet::internal::FixNewlines::argParamOpenFodder(FixNewlines *this,ArgParam *param)

{
  ostream *this_00;
  Fodder *in_RSI;
  Fodder *local_8;
  
  local_8 = in_RSI;
  if (in_RSI[1].
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    if (in_RSI[2].
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      this_00 = std::operator<<((ostream *)&std::cerr,"Invalid ArgParam");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      abort();
    }
    local_8 = internal::open_fodder((AST *)0x2cb9bb);
  }
  return local_8;
}

Assistant:

Fodder &argParamOpenFodder(ArgParam &param)
    {
        if (param.id != nullptr) {
            return param.idFodder;
        } else if (param.expr != nullptr) {
            return open_fodder(param.expr);
        } else {
            std::cerr << "Invalid ArgParam" << std::endl;
            abort();
        }
    }